

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O0

void defyx_calculate_hash(defyx_vm *machine,void *input,size_t inputSize,void *output)

{
  size_t in_RCX;
  void *in_RDX;
  size_t in_RSI;
  defyx_vm *in_RDI;
  int chain;
  int kangarooTwelve;
  int yescryptRH;
  int blakeResult;
  uint64_t tempHash [8];
  void *in_stack_00000070;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff74;
  size_t in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  int local_78;
  undefined1 local_68 [56];
  size_t in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  
  blake2b((void *)inputSize,(size_t)output,in_stack_00000070,tempHash[7],(void *)tempHash[6],
          tempHash[5]);
  uVar1 = 0;
  sipesh(in_RDI,in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,chain,
         yescryptRH);
  k12(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
      (void *)CONCAT44(in_stack_ffffffffffffff74,uVar1));
  (*in_RDI->_vptr_defyx_vm[6])(in_RDI,local_68);
  defyx_vm::resetRoundingMode((defyx_vm *)0x12d191);
  for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
    (*in_RDI->_vptr_defyx_vm[7])(in_RDI,local_68);
    defyx_vm::getRegisterFile(in_RDI);
    blake2b((void *)inputSize,(size_t)output,in_stack_00000070,tempHash[7],(void *)tempHash[6],
            tempHash[5]);
  }
  (*in_RDI->_vptr_defyx_vm[7])(in_RDI,local_68);
  (*in_RDI->_vptr_defyx_vm[3])(in_RDI,in_RCX,0x20);
  return;
}

Assistant:

void defyx_calculate_hash(defyx_vm *machine, const void *input, size_t inputSize, void *output) {
		assert(machine != nullptr);
		assert(inputSize == 0 || input != nullptr);
		assert(output != nullptr);
		alignas(16) uint64_t tempHash[8];
		int blakeResult = blake2b(tempHash, sizeof(tempHash), input, inputSize, nullptr, 0);
		int yescryptRH = sipesh(tempHash, sizeof(tempHash), input, inputSize, input, inputSize, 0, 0);
		int kangarooTwelve = k12(input, inputSize, tempHash);
		assert(blakeResult == 0);
		machine->initScratchpad(&tempHash);
		machine->resetRoundingMode();
		for (int chain = 0; chain < RANDOMX_PROGRAM_COUNT - 1; ++chain) {
			machine->run(&tempHash);
			blakeResult = blake2b(tempHash, sizeof(tempHash), machine->getRegisterFile(), sizeof(defyx::RegisterFile), nullptr, 0);
			assert(blakeResult == 0);
		}
		machine->run(&tempHash);
		machine->getFinalResult(output, RANDOMX_HASH_SIZE);
	}